

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall Assimp::ColladaExporter::WriteCamera(ColladaExporter *this,size_t pIndex)

{
  char *__s;
  undefined1 *puVar1;
  string *psVar2;
  aiCamera *paVar3;
  ostream *poVar4;
  string cameraId;
  string cameraName;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  
  paVar3 = this->mScene->mCameras[pIndex];
  __s = (paVar3->mName).data;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,__s,(allocator<char> *)&local_70);
  XMLEscape(&local_50,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_91);
  XMLIDEncode(&local_90,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  puVar1 = &this->field_0x38;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<camera id=\"",0xc);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-camera\" name=\"",0xf);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" >",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  psVar2 = &this->startstr;
  std::__cxx11::string::append((char *)psVar2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<optics>",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)psVar2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<technique_common>",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)psVar2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<perspective>",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)psVar2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<xfov sid=\"xfov\">",0x11);
  poVar4 = std::ostream::_M_insert<double>((double)(paVar3->mHorizontalFOV * 57.29578));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</xfov>",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<aspect_ratio>",0xe);
  poVar4 = std::ostream::_M_insert<double>((double)paVar3->mAspect);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</aspect_ratio>",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<znear sid=\"znear\">",0x13);
  poVar4 = std::ostream::_M_insert<double>((double)paVar3->mClipPlaneNear);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</znear>",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<zfar sid=\"zfar\">",0x11);
  poVar4 = std::ostream::_M_insert<double>((double)paVar3->mClipPlaneFar);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</zfar>",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  PopTag(this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</perspective>",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  PopTag(this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</technique_common>",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  PopTag(this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</optics>",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  PopTag(this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</camera>",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ColladaExporter::WriteCamera(size_t pIndex){

    const aiCamera *cam = mScene->mCameras[pIndex];
    const std::string cameraName = XMLEscape(cam->mName.C_Str());
    const std::string cameraId = XMLIDEncode(cam->mName.C_Str());

    mOutput << startstr << "<camera id=\"" << cameraId << "-camera\" name=\"" << cameraName << "\" >" << endstr;
    PushTag();
    mOutput << startstr << "<optics>" << endstr;
    PushTag();
    mOutput << startstr << "<technique_common>" << endstr;
    PushTag();
    //assimp doesn't support the import of orthographic cameras! se we write
    //always perspective
    mOutput << startstr << "<perspective>" << endstr;
    PushTag();
    mOutput << startstr << "<xfov sid=\"xfov\">"<<
                                AI_RAD_TO_DEG(cam->mHorizontalFOV)
                        <<"</xfov>" << endstr;
    mOutput << startstr << "<aspect_ratio>"
                        <<      cam->mAspect
                        << "</aspect_ratio>" << endstr;
    mOutput << startstr << "<znear sid=\"znear\">"
                        <<      cam->mClipPlaneNear
                        <<  "</znear>" << endstr;
    mOutput << startstr << "<zfar sid=\"zfar\">"
                        <<      cam->mClipPlaneFar
                        << "</zfar>" << endstr;
    PopTag();
    mOutput << startstr << "</perspective>" << endstr;
    PopTag();
    mOutput << startstr << "</technique_common>" << endstr;
    PopTag();
    mOutput << startstr << "</optics>" << endstr;
    PopTag();
    mOutput << startstr << "</camera>" << endstr;

}